

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_uri_escapes
              (yaml_parser_t *parser,int directive,yaml_mark_t start_mark,yaml_string_t *string)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_2c;
  uchar octet;
  int width;
  yaml_string_t *string_local;
  int directive_local;
  yaml_parser_t *parser_local;
  
  local_2c = 0;
  do {
    if ((parser->unread < 3) && (iVar5 = yaml_parser_update_buffer(parser,3), iVar5 == 0)) {
      return 0;
    }
    if (((*(parser->buffer).pointer != '%') ||
        (((((parser->buffer).pointer[1] < 0x30 || (0x39 < (parser->buffer).pointer[1])) &&
          (((parser->buffer).pointer[1] < 0x41 || (0x46 < (parser->buffer).pointer[1])))) &&
         (((parser->buffer).pointer[1] < 0x61 || (0x66 < (parser->buffer).pointer[1])))))) ||
       ((((parser->buffer).pointer[2] < 0x30 || (0x39 < (parser->buffer).pointer[2])) &&
        ((((parser->buffer).pointer[2] < 0x41 || (0x46 < (parser->buffer).pointer[2])) &&
         (((parser->buffer).pointer[2] < 0x61 || (0x66 < (parser->buffer).pointer[2])))))))) {
      pcVar6 = "while parsing a tag";
      if (directive != 0) {
        pcVar6 = "while parsing a %TAG directive";
      }
      iVar5 = yaml_parser_set_scanner_error
                        (parser,pcVar6,start_mark,"did not find URI escaped octet");
      return iVar5;
    }
    if (((parser->buffer).pointer[1] < 0x41) || (0x46 < (parser->buffer).pointer[1])) {
      if (((parser->buffer).pointer[1] < 0x61) || (0x66 < (parser->buffer).pointer[1])) {
        cVar2 = (parser->buffer).pointer[1] + 0xd0;
      }
      else {
        cVar2 = (parser->buffer).pointer[1] + 0xa9;
      }
    }
    else {
      cVar2 = (parser->buffer).pointer[1] + 0xc9;
    }
    if (((parser->buffer).pointer[2] < 0x41) || (0x46 < (parser->buffer).pointer[2])) {
      if (((parser->buffer).pointer[2] < 0x61) || (0x66 < (parser->buffer).pointer[2])) {
        cVar3 = (parser->buffer).pointer[2] + 0xd0;
      }
      else {
        cVar3 = (parser->buffer).pointer[2] + 0xa9;
      }
    }
    else {
      cVar3 = (parser->buffer).pointer[2] + 0xc9;
    }
    bVar4 = cVar2 * '\x10' + cVar3;
    if (local_2c == 0) {
      if ((bVar4 & 0x80) == 0) {
        local_50 = 1;
      }
      else {
        if ((bVar4 & 0xe0) == 0xc0) {
          local_54 = 2;
        }
        else {
          if ((bVar4 & 0xf0) == 0xe0) {
            local_58 = 3;
          }
          else {
            local_58 = 0;
            if ((bVar4 & 0xf8) == 0xf0) {
              local_58 = 4;
            }
          }
          local_54 = local_58;
        }
        local_50 = local_54;
      }
      local_2c = local_50;
      if (local_50 == 0) {
        pcVar6 = "while parsing a tag";
        if (directive != 0) {
          pcVar6 = "while parsing a %TAG directive";
        }
        iVar5 = yaml_parser_set_scanner_error
                          (parser,pcVar6,start_mark,"found an incorrect leading UTF-8 octet");
        return iVar5;
      }
    }
    else if ((bVar4 & 0xc0) != 0x80) {
      pcVar6 = "while parsing a tag";
      if (directive != 0) {
        pcVar6 = "while parsing a %TAG directive";
      }
      iVar5 = yaml_parser_set_scanner_error
                        (parser,pcVar6,start_mark,"found an incorrect trailing UTF-8 octet");
      return iVar5;
    }
    pbVar1 = string->pointer;
    string->pointer = pbVar1 + 1;
    *pbVar1 = bVar4;
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).column = (parser->mark).column + 1;
    parser->unread = parser->unread - 1;
    if ((*(parser->buffer).pointer & 0x80) == 0) {
      local_5c = 1;
    }
    else {
      if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
        local_60 = 2;
      }
      else {
        if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          local_64 = 3;
        }
        else {
          local_64 = 0;
          if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
            local_64 = 4;
          }
        }
        local_60 = local_64;
      }
      local_5c = local_60;
    }
    (parser->buffer).pointer = (parser->buffer).pointer + local_5c;
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).column = (parser->mark).column + 1;
    parser->unread = parser->unread - 1;
    if ((*(parser->buffer).pointer & 0x80) == 0) {
      local_68 = 1;
    }
    else {
      if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
        local_6c = 2;
      }
      else {
        if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          local_70 = 3;
        }
        else {
          local_70 = 0;
          if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
            local_70 = 4;
          }
        }
        local_6c = local_70;
      }
      local_68 = local_6c;
    }
    (parser->buffer).pointer = (parser->buffer).pointer + local_68;
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).column = (parser->mark).column + 1;
    parser->unread = parser->unread - 1;
    if ((*(parser->buffer).pointer & 0x80) == 0) {
      local_74 = 1;
    }
    else {
      if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
        local_78 = 2;
      }
      else {
        if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          local_7c = 3;
        }
        else {
          local_7c = 0;
          if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
            local_7c = 4;
          }
        }
        local_78 = local_7c;
      }
      local_74 = local_78;
    }
    (parser->buffer).pointer = (parser->buffer).pointer + local_74;
    local_2c = local_2c + -1;
  } while (local_2c != 0);
  return 1;
}

Assistant:

static int
yaml_parser_scan_uri_escapes(yaml_parser_t *parser, int directive,
        yaml_mark_t start_mark, yaml_string_t *string)
{
    int width = 0;

    /* Decode the required number of characters. */

    do {

        unsigned char octet = 0;

        /* Check for a URI-escaped octet. */

        if (!CACHE(parser, 3)) return 0;

        if (!(CHECK(parser->buffer, '%')
                    && IS_HEX_AT(parser->buffer, 1)
                    && IS_HEX_AT(parser->buffer, 2))) {
            return yaml_parser_set_scanner_error(parser, directive ?
                    "while parsing a %TAG directive" : "while parsing a tag",
                    start_mark, "did not find URI escaped octet");
        }

        /* Get the octet. */

        octet = (AS_HEX_AT(parser->buffer, 1) << 4) + AS_HEX_AT(parser->buffer, 2);

        /* If it is the leading octet, determine the length of the UTF-8 sequence. */

        if (!width)
        {
            width = (octet & 0x80) == 0x00 ? 1 :
                    (octet & 0xE0) == 0xC0 ? 2 :
                    (octet & 0xF0) == 0xE0 ? 3 :
                    (octet & 0xF8) == 0xF0 ? 4 : 0;
            if (!width) {
                return yaml_parser_set_scanner_error(parser, directive ?
                        "while parsing a %TAG directive" : "while parsing a tag",
                        start_mark, "found an incorrect leading UTF-8 octet");
            }
        }
        else
        {
            /* Check if the trailing octet is correct. */

            if ((octet & 0xC0) != 0x80) {
                return yaml_parser_set_scanner_error(parser, directive ?
                        "while parsing a %TAG directive" : "while parsing a tag",
                        start_mark, "found an incorrect trailing UTF-8 octet");
            }
        }

        /* Copy the octet and move the pointers. */

        *(string->pointer++) = octet;
        SKIP(parser);
        SKIP(parser);
        SKIP(parser);

    } while (--width);

    return 1;
}